

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type1ToType2Converter.cpp
# Opt level: O0

EStatusCode __thiscall
Type1ToType2Converter::CallOtherSubr
          (Type1ToType2Converter *this,LongList *inOperandList,LongList *outPostScriptOperandStack)

{
  long lVar1;
  const_reverse_iterator this_00;
  size_type sVar2;
  Trace *pTVar3;
  reference plVar4;
  bool local_79;
  undefined1 local_50 [4];
  EStatusCode status;
  _List_node_base *local_48;
  long i;
  long flexDepth;
  long argumentsCount;
  const_reverse_iterator it;
  LongList *outPostScriptOperandStack_local;
  LongList *inOperandList_local;
  Type1ToType2Converter *this_local;
  
  it.current._M_node =
       (_List_const_iterator<long>)(_List_const_iterator<long>)outPostScriptOperandStack;
  sVar2 = std::__cxx11::list<long,_std::allocator<long>_>::size(inOperandList);
  if (sVar2 < 3) {
    pTVar3 = Trace::DefaultTrace();
    sVar2 = std::__cxx11::list<long,_std::allocator<long>_>::size(inOperandList);
    Trace::TraceToLog(pTVar3,
                      "Type1ToType2Converter::CallOtherSubr, expecting at least 3 arguments for 0 callothersubr (0, arguments count, flex depth...and some other args), but operand stack has only %d arguments. aborting"
                      ,sVar2);
    this_local._4_4_ = eFailure;
  }
  else {
    std::__cxx11::list<long,_std::allocator<long>_>::rbegin
              ((list<long,_std::allocator<long>_> *)&argumentsCount);
    std::reverse_iterator<std::_List_const_iterator<long>_>::operator++
              ((reverse_iterator<std::_List_const_iterator<long>_> *)&argumentsCount);
    plVar4 = std::reverse_iterator<std::_List_const_iterator<long>_>::operator*
                       ((reverse_iterator<std::_List_const_iterator<long>_> *)&argumentsCount);
    flexDepth = *plVar4;
    sVar2 = std::__cxx11::list<long,_std::allocator<long>_>::size(inOperandList);
    if (sVar2 - 2 < (ulong)flexDepth) {
      pTVar3 = Trace::DefaultTrace();
      lVar1 = flexDepth;
      sVar2 = std::__cxx11::list<long,_std::allocator<long>_>::size(inOperandList);
      Trace::TraceToLog(pTVar3,
                        "Type1ToType2Converter::CallOtherSubr, arguments count for other subr is %ld, but there\'s only %d arguments available on the stack. aborting"
                        ,lVar1,sVar2 - 2);
      this_local._4_4_ = eFailure;
    }
    else {
      std::reverse_iterator<std::_List_const_iterator<long>_>::operator++
                ((reverse_iterator<std::_List_const_iterator<long>_> *)&argumentsCount);
      plVar4 = std::reverse_iterator<std::_List_const_iterator<long>_>::operator*
                         ((reverse_iterator<std::_List_const_iterator<long>_> *)&argumentsCount);
      i = *plVar4;
      std::__cxx11::list<long,_std::allocator<long>_>::push_back(&this->mFlexParameters,&i);
      local_48 = (_List_node_base *)0x0;
      while( true ) {
        local_79 = false;
        if ((long)local_48 < flexDepth) {
          std::__cxx11::list<long,_std::allocator<long>_>::rend
                    ((list<long,_std::allocator<long>_> *)local_50);
          local_79 = std::operator!=((reverse_iterator<std::_List_const_iterator<long>_> *)
                                     &argumentsCount,
                                     (reverse_iterator<std::_List_const_iterator<long>_> *)local_50)
          ;
        }
        this_00.current._M_node = it.current._M_node;
        if (local_79 == false) break;
        plVar4 = std::reverse_iterator<std::_List_const_iterator<long>_>::operator*
                           ((reverse_iterator<std::_List_const_iterator<long>_> *)&argumentsCount);
        std::__cxx11::list<long,_std::allocator<long>_>::push_back
                  ((list<long,_std::allocator<long>_> *)this_00.current._M_node,plVar4);
        std::reverse_iterator<std::_List_const_iterator<long>_>::operator++
                  ((reverse_iterator<std::_List_const_iterator<long>_> *)&argumentsCount);
        local_48 = (_List_node_base *)((long)&local_48->_M_next + 1);
      }
      this_local._4_4_ = RecordOperatorWithParameters(this,0xc23,&this->mFlexParameters);
      std::__cxx11::list<long,_std::allocator<long>_>::clear(&this->mFlexParameters);
      this->mInFlexCollectionMode = false;
      this->mIsFirst2Coordinates = false;
    }
  }
  return this_local._4_4_;
}

Assistant:

EStatusCode Type1ToType2Converter::CallOtherSubr(const LongList& inOperandList,LongList& outPostScriptOperandStack)
{
	if(inOperandList.size() < 3) {
		TRACE_LOG1("Type1ToType2Converter::CallOtherSubr, expecting at least 3 arguments for 0 callothersubr (0, arguments count, flex depth...and some other args), but operand stack has only %d arguments. aborting", inOperandList.size());
		return eFailure;
	}

	// should get here onther for 0 othersubr, to mark flex segment end. implement it...and also insert a node
	// for flex
	LongList::const_reverse_iterator it = inOperandList.rbegin();
	++it;
	long argumentsCount = *it;
	if(inOperandList.size() - 2 < argumentsCount) {
		TRACE_LOG2("Type1ToType2Converter::CallOtherSubr, arguments count for other subr is %ld, but there's only %d arguments available on the stack. aborting", argumentsCount,inOperandList.size()-2);
		return eFailure;

	}
	++it;

	// the next argument should be the FD...place it in the parameters collection
	long flexDepth = *it;

	mFlexParameters.push_back(flexDepth);

	// take care of the postscript operand stack
	for(long i=0;i<argumentsCount && it != inOperandList.rend();++i)
	{
		outPostScriptOperandStack.push_back(*it);
		++it;
	}

	// now finalize flex, by placing a type 2 flex command
	EStatusCode status = RecordOperatorWithParameters(0x0c23,mFlexParameters);

	// cleanup flex mode
	mFlexParameters.clear();
	mInFlexCollectionMode = false;
    mIsFirst2Coordinates = false;
	return status;
}